

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetStep.c
# Opt level: O3

Aig_Obj_t * Saig_ManRetimeNodeFwd(Aig_Man_t *p,Aig_Obj_t *pObj,int fMakeBug)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void **ppvVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int *piVar9;
  ulong uVar10;
  int *piVar11;
  Aig_Obj_t *pAVar12;
  ulong uVar13;
  
  if (p->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x34,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                  ,0x35,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  piVar9 = (int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  if ((piVar9[6] & 7U) == 2) {
    piVar11 = (int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if ((piVar11[6] & 7U) == 2) {
      iVar1 = *piVar9;
      iVar2 = p->nTruePis;
      if (iVar2 <= iVar1) {
        iVar3 = *piVar11;
        if (iVar2 <= iVar3) {
          if (iVar1 < 1) {
            __assert_fail("Aig_ObjCioId(pFanin0) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                          ,0x41,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
          }
          if (iVar3 < 1) {
            __assert_fail("Aig_ObjCioId(pFanin1) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                          ,0x42,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
          }
          if ((piVar9[8] == p->nTravIds) || (piVar11[8] == p->nTravIds)) {
            uVar7 = (iVar1 - iVar2) + p->nTruePos;
            if (-1 < (int)uVar7) {
              uVar4 = p->vCos->nSize;
              if ((((int)uVar7 < (int)uVar4) &&
                  (uVar8 = p->nTruePos + (iVar3 - iVar2), -1 < (int)uVar8)) && (uVar8 < uVar4)) {
                ppvVar5 = p->vCos->pArray;
                uVar13 = (ulong)((uint)pObj->pFanin0 & 1);
                uVar6 = *(ulong *)((long)ppvVar5[uVar7] + 8);
                uVar10 = (ulong)((uint)pObj->pFanin1 & 1);
                pAVar12 = (Aig_Obj_t *)(*(ulong *)((long)ppvVar5[uVar8] + 8) ^ uVar10);
                if (fMakeBug != 0) {
                  puts("Introducing bug during retiming.");
                  pAVar12 = (Aig_Obj_t *)((ulong)pAVar12 ^ 1);
                }
                pAVar12 = Aig_And(p,(Aig_Obj_t *)(uVar6 ^ uVar13),pAVar12);
                if (uVar13 == 0) {
                  uVar10 = 0;
                }
                pAVar12 = Aig_ObjCreateCo(p,(Aig_Obj_t *)((ulong)pAVar12 ^ uVar10));
                (pAVar12->field_0).CioId = p->nObjs[3] + -1;
                pAVar12 = Aig_ObjCreateCi(p);
                (pAVar12->field_0).CioId = p->nObjs[2] + -1;
                p->nRegs = p->nRegs + 1;
                pAVar12->TravId = p->nTravIds;
                return (Aig_Obj_t *)(uVar10 ^ (ulong)pAVar12);
              }
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
        }
      }
    }
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs one retiming step forward.]

  Description [Returns the pointer to the register output after retiming.]
               
  SideEffects [Remember to run Aig_ManSetCioIds() in advance.]

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Saig_ManRetimeNodeFwd( Aig_Man_t * p, Aig_Obj_t * pObj, int fMakeBug )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    Aig_Obj_t * pInput0, * pInput1;
    Aig_Obj_t * pObjNew, * pObjLi, * pObjLo;
    int fCompl;

    assert( Saig_ManRegNum(p) > 0 );
    assert( Aig_ObjIsNode(pObj) );

    // get the fanins
    pFanin0 = Aig_ObjFanin0(pObj);
    pFanin1 = Aig_ObjFanin1(pObj);
    // skip of they are not primary inputs
    if ( !Aig_ObjIsCi(pFanin0) || !Aig_ObjIsCi(pFanin1) )
        return NULL;

    // skip of they are not register outputs
    if ( !Saig_ObjIsLo(p, pFanin0) || !Saig_ObjIsLo(p, pFanin1) )
        return NULL;
    assert( Aig_ObjCioId(pFanin0) > 0 );
    assert( Aig_ObjCioId(pFanin1) > 0 );

    // skip latch guns
    if ( !Aig_ObjIsTravIdCurrent(p, pFanin0) && !Aig_ObjIsTravIdCurrent(p, pFanin1) )
        return NULL;

    // get the inputs of these registers
    pInput0 = Saig_ManLi( p, Aig_ObjCioId(pFanin0) - Saig_ManPiNum(p) );
    pInput1 = Saig_ManLi( p, Aig_ObjCioId(pFanin1) - Saig_ManPiNum(p) );
    pInput0 = Aig_ObjChild0( pInput0 );
    pInput1 = Aig_ObjChild0( pInput1 );
    pInput0 = Aig_NotCond( pInput0, Aig_ObjFaninC0(pObj) );
    pInput1 = Aig_NotCond( pInput1, Aig_ObjFaninC1(pObj) );
    // get the condition when the register should be complemetned
    fCompl = Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj);

    if ( fMakeBug )
    {
        printf( "Introducing bug during retiming.\n" );
        pInput1 = Aig_Not( pInput1 );
    }

    // create new node
    pObjNew = Aig_And( p, pInput0, pInput1 );

    // create new register input
    pObjLi = Aig_ObjCreateCo( p, Aig_NotCond(pObjNew, fCompl) );
    pObjLi->CioId = Aig_ManCoNum(p) - 1;

    // create new register output
    pObjLo = Aig_ObjCreateCi( p );
    pObjLo->CioId = Aig_ManCiNum(p) - 1;
    p->nRegs++;

    // make sure the register is retimable.
    Aig_ObjSetTravIdCurrent(p, pObjLo);

//printf( "Reg = %4d. Reg = %4d. Compl = %d. Phase = %d.\n", 
//       pFanin0->PioNum, pFanin1->PioNum, Aig_IsComplement(pObjNew), fCompl );

    // return register output
    return Aig_NotCond( pObjLo, fCompl );
}